

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

bool __thiscall ASDCP::Dictionary::DeleteEntry(Dictionary *this,ui32_t index)

{
  bool bVar1;
  pointer ppVar2;
  MDDEntry *pMVar3;
  undefined8 local_60;
  MDDEntry NilEntry;
  _Self local_38;
  iterator ii;
  _Self local_28;
  iterator rii;
  ui32_t index_local;
  Dictionary *this_local;
  
  rii._M_node._4_4_ = index;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
       ::find(&this->m_md_rev_lookup,(key_type *)((long)&rii._M_node + 4));
  ii._M_node = (_Base_ptr)
               std::
               map<unsigned_int,_ASDCP::UL,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
               ::end(&this->m_md_rev_lookup);
  bVar1 = std::operator!=(&local_28,(_Self *)&ii);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_ASDCP::UL>_>::operator->
                       (&local_28);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::find(&this->m_md_lookup,&ppVar2->second);
    NilEntry.name =
         (char *)std::
                 map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
                 ::end(&this->m_md_lookup);
    bVar1 = std::operator!=(&local_38,(_Self *)&NilEntry.name);
    if (!bVar1) {
      __assert_fail("ii != m_md_lookup.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                    ,0x104,"bool ASDCP::Dictionary::DeleteEntry(ui32_t)");
    }
    memset(&local_60,0,0x20);
    std::
    map<ASDCP::UL,unsigned_int,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
    ::erase_abi_cxx11_((map<ASDCP::UL,unsigned_int,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,unsigned_int>>>
                        *)this,(iterator)local_38._M_node);
    std::
    map<unsigned_int,ASDCP::UL,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
    ::erase_abi_cxx11_((map<unsigned_int,ASDCP::UL,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ASDCP::UL>>>
                        *)&this->m_md_rev_lookup,(iterator)local_28._M_node);
    pMVar3 = this->m_MDD_Table + rii._M_node._4_4_;
    *(undefined8 *)pMVar3->ul = local_60;
    *(undefined8 *)(pMVar3->ul + 8) = NilEntry.ul._0_8_;
    (pMVar3->tag).a = NilEntry.ul[8];
    (pMVar3->tag).b = NilEntry.ul[9];
    pMVar3->optional = (bool)NilEntry.ul[10];
    pMVar3->field_0x13 = NilEntry.ul[0xb];
    pMVar3->field_0x14 = NilEntry.ul[0xc];
    pMVar3->field_0x15 = NilEntry.ul[0xd];
    pMVar3->field_0x16 = NilEntry.ul[0xe];
    pMVar3->field_0x17 = NilEntry.ul[0xf];
    pMVar3->name = (char *)NilEntry._16_8_;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ASDCP::Dictionary::DeleteEntry(ui32_t index)
{
  std::map<ui32_t, ASDCP::UL>::iterator rii = m_md_rev_lookup.find(index);
  if ( rii != m_md_rev_lookup.end() )
    {
      std::map<ASDCP::UL, ui32_t>::iterator ii = m_md_lookup.find(rii->second);
      assert(ii != m_md_lookup.end());

      MDDEntry NilEntry;
      memset(&NilEntry, 0, sizeof(NilEntry));

      m_md_lookup.erase(ii);
      m_md_rev_lookup.erase(rii);
      m_MDD_Table[index] = NilEntry;
      return true;
    }

  return false;
}